

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_disk_posix.c
# Opt level: O0

wchar_t archive_write_disk_set_acls
                  (archive *a,wchar_t fd,char *name,archive_acl *abstract_acl,mode_t mode)

{
  mode_t mode_local;
  archive_acl *abstract_acl_local;
  char *name_local;
  wchar_t fd_local;
  archive *a_local;
  
  return L'\0';
}

Assistant:

int
archive_write_disk_set_acls(struct archive *a, int fd, const char *name,
    struct archive_acl *abstract_acl, __LA_MODE_T mode)
{
	(void)a; /* UNUSED */
	(void)fd; /* UNUSED */
	(void)name; /* UNUSED */
	(void)abstract_acl; /* UNUSED */
	(void)mode; /* UNUSED */
	return (ARCHIVE_OK);
}